

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  uchar *puVar2;
  char cVar3;
  long lVar4;
  logdir *plVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char ch;
  char local_39;
  long local_38;
  
  progname = *argv;
  iVar6 = sgetoptmine(argc,argv,"R:r:l:b:tvV");
  if (iVar6 != subgetoptdone) {
    do {
      if (iVar6 < 0x6c) {
        if (iVar6 < 0x56) {
          if (iVar6 == 0x3f) {
LAB_00105f68:
            strerr_die(0x6f,"usage: ",progname,
                       " [-ttv] [-r c] [-R abc] [-l len] [-b buflen] dir ...","\n",(char *)0x0,
                       (char *)0x0,(strerr *)0x0);
          }
          else if ((iVar6 == 0x52) && (replace = subgetoptarg, repl == '\0')) {
            repl = '_';
          }
        }
        else {
          if (iVar6 == 0x56) {
            strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                        (strerr *)0x0);
            goto LAB_00105f68;
          }
          if ((iVar6 == 0x62) && (scan_ulong(subgetoptarg,&buflen), buflen == 0)) {
            buflen = 0x400;
          }
        }
      }
      else if (iVar6 < 0x74) {
        if (iVar6 == 0x6c) {
          scan_ulong(subgetoptarg,&linemax);
          if (linemax == 0) {
            linemax = 1000;
          }
        }
        else if ((iVar6 == 0x72) &&
                ((repl = *subgetoptarg, repl == '\0' || (subgetoptarg[1] != '\0'))))
        goto LAB_00105f68;
      }
      else if (iVar6 == 0x74) {
        timestamp = timestamp + 1;
        if (2 < timestamp) {
          timestamp = 3;
        }
      }
      else if (iVar6 == 0x76) {
        verbose = verbose + 1;
      }
      iVar6 = sgetoptmine(argc,argv,"R:r:l:b:tvV");
    } while (iVar6 != subgetoptdone);
  }
  local_38 = (long)subgetoptind;
  dirn = argc - subgetoptind;
  if (dirn == 0) {
    strerr_die(0x6f,"usage: ",progname," [-ttv] [-r c] [-R abc] [-l len] [-b buflen] dir ...","\n",
               (char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  if (buflen <= linemax) {
    strerr_die(0x6f,"usage: ",progname," [-ttv] [-r c] [-R abc] [-l len] [-b buflen] dir ...","\n",
               (char *)0x0,(char *)0x0,(strerr *)0x0);
  }
  fdwdir = open_read(".");
  if (fdwdir == -1) {
    strerr_die(0x6f,"svlogd: fatal: ","unable to open current working directory",": ",(char *)0x0,
               (char *)0x0,(char *)0x0,&strerr_sys);
  }
  coe(fdwdir);
  dir = (logdir *)alloc(dirn * 0xf0);
  if (dir == (logdir *)0x0) {
    strerr_die(0x6f,"svlogd: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  if (dirn != 0) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      plVar5 = dir;
      *(undefined4 *)((long)&dir->fddir + lVar11) = 0xffffffff;
      puVar2 = (plVar5->udpaddr).sin_zero + lVar11 + -0x14;
      puVar2[0] = 0xff;
      puVar2[1] = 0xff;
      puVar2[2] = 0xff;
      puVar2[3] = 0xff;
      pcVar8 = alloc((uint)buflen);
      *(char **)((long)&dir->btmp + lVar11) = pcVar8;
      if (*(long *)((long)&dir->btmp + lVar11) == 0) {
        strerr_die(0x6f,"svlogd: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
                   (char *)0x0,(strerr *)0x0);
      }
      pcVar8 = dir->fnsave + lVar11 + -4;
      pcVar8[0] = '\0';
      pcVar8[1] = '\0';
      pcVar8[2] = '\0';
      pcVar8[3] = '\0';
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0xf0;
    } while (uVar10 < dirn);
  }
  databuf = alloc((uint)buflen);
  if (databuf == (char *)0x0) {
    strerr_die(0x6f,"svlogd: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  ppcVar1 = argv + local_38;
  buffer_init(&data,buffer_pread,0,databuf,(uint)buflen);
  line = alloc((uint)linemax);
  if (line == (char *)0x0) {
    strerr_die(0x6f,"svlogd: fatal: ","out of memory.",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(strerr *)0x0);
  }
  in.fd = 0;
  in.events = 1;
  fndir = ppcVar1;
  ndelay_on(0);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sig_catch(sig_term,sig_term_handler);
  sig_catch(sig_child,sig_child_handler);
  sig_catch(sig_alarm,sig_alarm_handler);
  sig_catch(sig_hangup,sig_hangup_handler);
  logdirs_reopen();
  do {
    linelen = 0;
    if (linemax != 0) {
      do {
        if (data.p == 0) {
          iVar6 = buffer_get(&data,&local_39,1);
          if (iVar6 < 1) {
            exitasap = 1;
            break;
          }
        }
        else {
          local_39 = data.x[data.n];
          data.p = data.p - 1;
          data.n = data.n + 1;
        }
        if ((linelen == 0) && (timestamp != 0)) {
          taia_now(&now);
          if (timestamp == 3) {
            fmt_ptime_iso8601(stamp,&now);
          }
          else if (timestamp == 2) {
            fmt_ptime(stamp,&now);
          }
          else if (timestamp == 1) {
            fmt_taia(stamp,&now);
          }
          stamp[0x19] = ' ';
          stamp[0x1a] = '\0';
        }
        if (local_39 == '\n') break;
        if (repl != '\0') {
          if ((byte)(local_39 + 0x81U) < 0xa1) {
LAB_001063ec:
            local_39 = repl;
          }
          else {
            cVar3 = *replace;
            pcVar8 = replace;
            while (cVar3 != '\0') {
              pcVar8 = pcVar8 + 1;
              if (local_39 == cVar3) goto LAB_001063ec;
              cVar3 = *pcVar8;
            }
          }
        }
        line[linelen] = local_39;
        linelen = linelen + 1;
      } while (linelen < linemax);
    }
    if (data.p == 0 && exitasap != 0) break;
    local_38 = CONCAT71(local_38._1_7_,data.p != 0 || exitasap == 0);
    if (dirn != 0) {
      uVar10 = 0;
      do {
        if (dir[uVar10].fddir != -1) {
          if (dir[uVar10].inst.len != 0) {
            logmatch(dir + uVar10);
          }
          if (dir[uVar10].matcherr == 'e') {
            if (timestamp != 0) {
              buffer_puts(buffer_2,stamp);
            }
            if (dir[uVar10].prefix.len != 0) {
              buffer_puts(buffer_2,dir[uVar10].prefix.s);
            }
            buffer_put(buffer_2,line,(uint)linelen);
            if (linelen == linemax) {
              buffer_puts(buffer_2,"...");
            }
            buffer_put(buffer_2,"\n",1);
            buffer_flush(buffer_2);
          }
          if (dir[uVar10].match == '+') {
            if (dir[uVar10].udpaddr.sin_port != 0) {
              fdudp = socket(2,2,0);
              if ((fdudp != 0) && (iVar6 = ndelay_on(fdudp), iVar6 == -1)) {
                close(fdudp);
                fdudp = -1;
              }
              if (fdudp == -1) {
                buffer_puts(&dir[uVar10].b,"warning: no udp socket available: ");
                if (timestamp != 0) {
                  buffer_puts(&dir[uVar10].b,stamp);
                }
                if (dir[uVar10].prefix.len != 0) {
                  buffer_puts(&dir[uVar10].b,dir[uVar10].prefix.s);
                }
                buffer_put(&dir[uVar10].b,line,(uint)linelen);
                buffer_put(&dir[uVar10].b,"\n",1);
                buffer_flush(&dir[uVar10].b);
              }
              else {
                while (iVar6 = stralloc_copys(&sa,""), iVar6 == 0) {
                  strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                              (char *)0x0,(char *)0x0,(strerr *)0x0);
                  sleep(3);
                }
                if (timestamp != 0) {
                  while (iVar6 = stralloc_cats(&sa,stamp), iVar6 == 0) {
                    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                                (char *)0x0,(char *)0x0,(strerr *)0x0);
                    sleep(3);
                  }
                }
                if (dir[uVar10].prefix.len != 0) {
                  while (iVar6 = stralloc_cats(&sa,dir[uVar10].prefix.s), iVar6 == 0) {
                    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                                (char *)0x0,(char *)0x0,(strerr *)0x0);
                    sleep(3);
                  }
                }
                while( true ) {
                  iVar6 = stralloc_catb(&sa,line,(uint)linelen);
                  if (iVar6 != 0) break;
                  strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                              (char *)0x0,(char *)0x0,(strerr *)0x0);
                  sleep(3);
                }
                if (linelen == linemax) {
                  while (iVar6 = stralloc_cats(&sa,"..."), iVar6 == 0) {
                    strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                                (char *)0x0,(char *)0x0,(strerr *)0x0);
                    sleep(3);
                  }
                }
                while (iVar6 = stralloc_append(&sa,"\n"), iVar6 == 0) {
                  strerr_warn("svlogd: pausing: ","out of memory.",(char *)0x0,(char *)0x0,
                              (char *)0x0,(char *)0x0,(strerr *)0x0);
                  sleep(3);
                }
                uVar9 = sendto(fdudp,sa.s,(ulong)sa.len,0,(sockaddr *)&dir[uVar10].udpaddr,0x10);
                if (uVar9 != sa.len) {
                  buffer_puts(&dir[uVar10].b,"warning: failure sending through udp: ");
                  buffer_put(&dir[uVar10].b,sa.s,sa.len);
                  buffer_flush(&dir[uVar10].b);
                }
                close(fdudp);
              }
            }
            if (dir[uVar10].udponly == 0) {
              if (timestamp != 0) {
                buffer_puts(&dir[uVar10].b,stamp);
              }
              if (dir[uVar10].prefix.len != 0) {
                buffer_puts(&dir[uVar10].b,dir[uVar10].prefix.s);
              }
              buffer_put(&dir[uVar10].b,line,(uint)linelen);
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < dirn);
    }
    if (linelen == linemax) {
LAB_00106990:
      if (data.p == 0) {
        iVar6 = buffer_get(&data,&local_39,1);
        if (iVar6 < 1) {
          exitasap = 1;
          goto LAB_00106a73;
        }
      }
      else {
        local_39 = data.x[data.n];
        data.p = data.p - 1;
        data.n = data.n + 1;
      }
      if (local_39 == '\n') goto LAB_00106a73;
      if (dirn != 0) {
        lVar11 = 0;
        uVar10 = 0;
        do {
          if (((*(int *)((long)&dir->fddir + lVar11) != -1) &&
              ((dir->udpaddr).sin_zero[lVar11 + -0xc] == '+')) &&
             (*(int *)((long)(&dir->udpaddr + 1) + lVar11) == 0)) {
            uVar7 = *(uint *)(dir->fnsave + lVar11 + -0x7c);
            if (*(uint *)(dir->fnsave + lVar11 + -0x78) == uVar7) {
              buffer_put((buffer *)((long)&(dir->b).x + lVar11),&local_39,1);
            }
            else {
              lVar4 = *(long *)((long)&(dir->b).x + lVar11);
              *(uint *)(dir->fnsave + lVar11 + -0x7c) = uVar7 + 1;
              *(char *)(lVar4 + (ulong)uVar7) = local_39;
            }
          }
          uVar10 = uVar10 + 1;
          lVar11 = lVar11 + 0xf0;
        } while (uVar10 < dirn);
      }
      goto LAB_00106990;
    }
LAB_00106a73:
    if (dirn != 0) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        if (((*(int *)((long)&dir->fddir + lVar11) != -1) &&
            ((dir->udpaddr).sin_zero[lVar11 + -0xc] == '+')) &&
           (*(int *)((long)(&dir->udpaddr + 1) + lVar11) == 0)) {
          local_39 = '\n';
          uVar7 = *(uint *)(dir->fnsave + lVar11 + -0x7c);
          if (*(uint *)(dir->fnsave + lVar11 + -0x78) == uVar7) {
            buffer_put((buffer *)((long)&(dir->b).x + lVar11),&local_39,1);
          }
          else {
            lVar4 = *(long *)((long)&(dir->b).x + lVar11);
            *(uint *)(dir->fnsave + lVar11 + -0x7c) = uVar7 + 1;
            *(undefined1 *)(lVar4 + (ulong)uVar7) = 10;
          }
          buffer_flush((buffer *)((long)&(dir->b).x + lVar11));
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0xf0;
      } while (uVar10 < dirn);
    }
  } while ((char)local_38 != '\0');
  if (dirn != 0) {
    uVar10 = 0;
    do {
      if (dir[uVar10].ppid != 0) {
        do {
          uVar7 = processorstop(dir + uVar10);
        } while (uVar7 == 0);
      }
      logdir_close(dir + uVar10);
      uVar10 = uVar10 + 1;
    } while (uVar10 < dirn);
  }
  _exit(0);
}

Assistant:

int main(int argc, const char **argv) {
  int i;
  int opt;

  progname =*argv;

  while ((opt =getopt(argc, argv, "R:r:l:b:tvV")) != opteof) {
    switch(opt) {
    case 'R':
      replace =optarg;
      if (! repl) repl ='_';
      break;
    case 'r':
      repl =*optarg;
      if (! repl || *(optarg +1)) usage();
      break;
    case 'l':
      scan_ulong(optarg, &linemax);
      if (linemax == 0) linemax =1000;
      break;
    case 'b':
      scan_ulong(optarg, &buflen);
      if (buflen == 0) buflen =1024;
      break;
    case 't':
      if (++timestamp > 3) timestamp =3;
      break;
    case 'v':
      ++verbose;
      break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  }
  argv +=optind;

  dirn =argc -optind;
  if (dirn <= 0) usage();
  if (buflen <= linemax) usage();
  if ((fdwdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  coe(fdwdir);
  dir =(struct logdir*)alloc(dirn *sizeof(struct logdir));
  if (! dir) die_nomem();
  for (i =0; i < dirn; ++i) {
    dir[i].fddir =-1; dir[i].fdcur =-1;
    dir[i].btmp =(char*)alloc(buflen *sizeof(char));
    if (! dir[i].btmp) die_nomem();
    dir[i].ppid =0;
  }
  databuf =(char*)alloc(buflen *sizeof(char));
  if (! databuf) die_nomem();
  buffer_init(&data, buffer_pread, 0, databuf, buflen);
  line =(char*)alloc(linemax *sizeof(char));
  if (! line) die_nomem();
  fndir =argv;
  in.fd =0;
  in.events =IOPAUSE_READ;
  ndelay_on(in.fd);

  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sig_catch(sig_term, sig_term_handler);
  sig_catch(sig_child, sig_child_handler);
  sig_catch(sig_alarm, sig_alarm_handler);
  sig_catch(sig_hangup, sig_hangup_handler);

  logdirs_reopen();

  for(;;) {
    char ch;

    linelen =0;
    for (linelen =0; linelen < linemax; ++linelen) {
      if (buffer_GETC(&data, &ch) <= 0) {
        exitasap =1;
        break;
      }
      if (! linelen && timestamp) {
        taia_now(&now);
        switch (timestamp) {
        case 1: fmt_taia(stamp, &now); break;
        case 2: fmt_ptime(stamp, &now); break;
        case 3: fmt_ptime_iso8601(stamp, &now); break;
        }
        stamp[25] =' '; stamp[26] =0;
      }
      if (ch == '\n') break;
      if (repl) {
        if ((ch < 32) || (ch > 126))
          ch =repl;
        else
          for (i =0; replace[i]; ++i)
            if (ch == replace[i]) {
              ch =repl;
              break;
            }
      }
      line[linelen] =ch;
    }
    if (exitasap && ! data.p) break; /* data buffer is empty */
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].inst.len) logmatch(&dir[i]);
        if (dir[i].matcherr == 'e') {
          if (timestamp) buffer_puts(buffer_2, stamp);
          if (dir[i].prefix.len) buffer_puts(buffer_2, dir[i].prefix.s);
          buffer_put(buffer_2, line, linelen);
          if (linelen == linemax) buffer_puts(buffer_2, "...");
          buffer_put(buffer_2, "\n", 1); buffer_flush(buffer_2);
        }
        if (dir[i].match != '+') continue;
        if (dir[i].udpaddr.sin_port != 0) {
          fdudp =socket(AF_INET, SOCK_DGRAM, 0);
          if (fdudp)
            if (ndelay_on(fdudp) == -1) {
              close(fdudp);
              fdudp =-1;
            }
          if (fdudp == -1) {
            buffer_puts(&dir[i].b, "warning: no udp socket available: ");
            if (timestamp) buffer_puts(&dir[i].b, stamp);
            if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
            buffer_put(&dir[i].b, line, linelen);
            buffer_put(&dir[i].b, "\n", 1);
            buffer_flush(&dir[i].b);
          }
          else {
            while (! stralloc_copys(&sa, "")) pause_nomem();
            if (timestamp)
              while (! stralloc_cats(&sa, stamp)) pause_nomem();
            if (dir[i].prefix.len)
              while (! stralloc_cats(&sa, dir[i].prefix.s)) pause_nomem();
            while (! stralloc_catb(&sa, line, linelen)) pause_nomem();
            if (linelen == linemax)
              while (! stralloc_cats(&sa, "...")) pause_nomem();
            while (! stralloc_append(&sa, "\n")) pause_nomem();
            if (sendto(fdudp, sa.s, sa.len, 0,
                       (struct sockaddr *)&dir[i].udpaddr,
                       sizeof(dir[i].udpaddr)) != sa.len) {
              buffer_puts(&dir[i].b, "warning: failure sending through udp: ");
              buffer_put(&dir[i].b, sa.s, sa.len);
              buffer_flush(&dir[i].b);
            }
            close(fdudp);
          }
        }
        if (! dir[i].udponly) {
          if (timestamp) buffer_puts(&dir[i].b, stamp);
          if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
          buffer_put(&dir[i].b, line, linelen);
        }
      }
    if (linelen == linemax)
      for (;;) {
        if (buffer_GETC(&data, &ch) <= 0) {
          exitasap =1;
          break;
        }
        if (ch == '\n') break;
        for (i =0; i < dirn; ++i)
          if (dir[i].fddir != -1) {
            if (dir[i].match != '+') continue;
            if (! dir[i].udponly) buffer_PUTC(&dir[i].b, ch);
          }
      }
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].match != '+') continue;
        if (! dir[i].udponly) {
          ch ='\n';
          buffer_PUTC(&dir[i].b, ch);
          buffer_flush(&dir[i].b);
        }
      }
  }

  for (i =0; i < dirn; ++i) {
    if (dir[i].ppid) while (! processorstop(&dir[i]));
    logdir_close(&dir[i]);
  }
  _exit(0);
}